

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O2

void __thiscall QRadioButton::mouseMoveEvent(QRadioButton *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long in_FS_OFFSET;
  QPointF local_40;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar2 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
  if (bVar2) {
    bVar3 = 0;
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0) {
      local_40 = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_30 = QPointF::toPoint(&local_40);
      bVar3 = (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1a0))(this);
    }
    if (bVar3 != (*(byte *)(lVar1 + 0x2b4) & 1)) {
      QWidget::update((QWidget *)this);
      *(byte *)(lVar1 + 0x2b4) = *(byte *)(lVar1 + 0x2b4) & 0xfe | bVar3;
    }
  }
  QAbstractButton::mouseMoveEvent(&this->super_QAbstractButton,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRadioButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QRadioButton);
    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update();
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}